

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by.cpp
# Opt level: O3

void DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_27(void)

{
  code *pcVar1;
  char extraout_AL;
  double __x;
  ResultBuilder DOCTEST_RB;
  ExpressionDecomposer local_e4;
  undefined8 local_e0;
  int local_d4;
  Result local_d0;
  undefined8 *local_b0;
  Enum local_a8;
  ResultBuilder local_a0;
  
  local_e0 = 1;
  doctest::String::String((String *)&local_d0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/tuple/by.cpp"
             ,0xd7,"calls == 1","",(String *)&local_d0);
  doctest::String::~String((String *)&local_d0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_e4,DT_CHECK);
  local_b0 = &local_e0;
  local_a8 = local_e4.m_at;
  local_d4 = 1;
  doctest::detail::Expression_lhs<unsigned_long&>::operator==
            (&local_d0,(Expression_lhs<unsigned_long&> *)&local_b0,&local_d4);
  doctest::detail::ResultBuilder::setResult(&local_a0,&local_d0);
  doctest::String::~String(&local_d0.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a0,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&local_a0);
  doctest::String::~String((String *)&local_a0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a0.super_AssertData.m_decomp);
  doctest::String::~String(&local_a0.super_AssertData.m_exception);
  return;
}

Assistant:

~dummy ()
        {
            --instances_count;
        }